

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QModelIndexList * __thiscall
QItemSelection::indexes(QModelIndexList *__return_storage_ptr__,QItemSelection *this)

{
  QItemSelectionRange *range;
  QItemSelectionRange *range_00;
  long lVar1;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  range_00 = (this->super_QList<QItemSelectionRange>).d.ptr;
  for (lVar1 = (this->super_QList<QItemSelectionRange>).d.size << 4; lVar1 != 0;
      lVar1 = lVar1 + -0x10) {
    indexesFromRange<QList<QModelIndex>>(range_00,__return_storage_ptr__);
    range_00 = range_00 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QItemSelection::indexes() const
{
    return qSelectionIndexes<QModelIndexList>(*this);
}